

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSat.c
# Opt level: O1

DdNode * Cudd_ShortestPath(DdManager *manager,DdNode *f,int *weight,int *support,int *length)

{
  int *piVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  st__table *visited;
  long lVar7;
  uint uVar8;
  DdNode *pDVar9;
  ulong uVar10;
  DdNode *pDVar11;
  uint *puVar12;
  uint *key;
  uint *puVar13;
  cuddPathPair *rootPair;
  cuddPathPair *T_pair;
  int local_94;
  char *local_48;
  int *local_40;
  int *local_38;
  
  pDVar9 = manager->one;
  pDVar11 = manager->zero;
  one = pDVar9;
  zero = pDVar11;
  if ((support != (int *)0x0) && (0 < manager->size)) {
    lVar7 = 0;
    do {
      support[lVar7] = 0;
      lVar7 = lVar7 + 1;
    } while (lVar7 < manager->size);
  }
  pDVar9 = (DdNode *)((ulong)pDVar9 ^ 1);
  local_94 = 1000000;
  if (pDVar11 != f && pDVar9 != f) {
    key = (uint *)((ulong)f & 0xfffffffffffffffe);
    do {
      manager->reordered = 0;
      visited = st__init_table(st__ptrcmp,st__ptrhash);
      getShortest(f,weight,support,visited);
      iVar4 = st__lookup(visited,(char *)key,&local_48);
      pDVar9 = one;
      if (iVar4 == 0) {
        return (DdNode *)0x0;
      }
      local_94 = *(int *)(local_48 + ((uint)f * 4 & 4));
      piVar1 = (int *)(((ulong)one & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      uVar5 = *key;
      puVar12 = key;
      iVar4 = local_94;
      uVar8 = (uint)f;
      while (pDVar11 = pDVar9, uVar5 != 0x7fffffff) {
        while( true ) {
          if (weight == (int *)0x0) {
            iVar6 = 1;
          }
          else {
            iVar6 = weight[uVar5];
          }
          uVar10 = *(ulong *)(puVar12 + 6) ^ 1;
          uVar3 = *(ulong *)(puVar12 + 4) ^ 1;
          if ((uVar8 & 1) == 0) {
            uVar10 = *(ulong *)(puVar12 + 6);
            uVar3 = *(ulong *)(puVar12 + 4);
          }
          puVar13 = (uint *)(uVar3 & 0xfffffffffffffffe);
          st__lookup(visited,(char *)puVar13,(char **)&local_38);
          uVar8 = (uint)uVar3;
          if ((uVar3 & 1) == 0) {
            iVar2 = *local_38;
          }
          else {
            iVar2 = local_38[1];
          }
          if (iVar2 == iVar4 - iVar6) break;
          puVar13 = (uint *)(uVar10 & 0xfffffffffffffffe);
          st__lookup(visited,(char *)puVar13,(char **)&local_40);
          uVar8 = (uint)uVar10;
          if ((uVar10 & 1) == 0) {
            iVar6 = *local_40;
          }
          else {
            iVar6 = local_40[1];
          }
          if (iVar6 != iVar4) {
            fwrite("We shouldn\'t be here!!\n",0x17,1,(FILE *)manager->err);
            manager->errorCode = CUDD_INTERNAL_ERROR;
LAB_008032a4:
            pDVar9 = (DdNode *)0x0;
            goto LAB_008032a6;
          }
          pDVar9 = cuddBddAndRecur(manager,(DdNode *)((ulong)manager->vars[*puVar12] ^ 1),pDVar11);
          if (pDVar9 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(manager,pDVar11);
            goto LAB_008032a4;
          }
          piVar1 = (int *)(((ulong)pDVar9 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          Cudd_RecursiveDeref(manager,pDVar11);
          uVar5 = *puVar13;
          pDVar11 = pDVar9;
          puVar12 = puVar13;
          if (uVar5 == 0x7fffffff) goto LAB_008030d9;
        }
        pDVar9 = cuddBddAndRecur(manager,manager->vars[*puVar12],pDVar11);
        if (pDVar9 == (DdNode *)0x0) {
          Cudd_RecursiveDeref(manager,pDVar11);
          pDVar9 = (DdNode *)0x0;
          goto LAB_008032a6;
        }
        piVar1 = (int *)(((ulong)pDVar9 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        Cudd_RecursiveDeref(manager,pDVar11);
        puVar12 = puVar13;
        iVar4 = iVar4 - iVar6;
        uVar5 = *puVar13;
      }
LAB_008030d9:
      piVar1 = (int *)(((ulong)pDVar9 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + -1;
LAB_008032a6:
      st__foreach(visited,freePathPair,(char *)0x0);
      st__free_table(visited);
    } while (manager->reordered == 1);
  }
  *length = local_94;
  return pDVar9;
}

Assistant:

DdNode *
Cudd_ShortestPath(
  DdManager * manager,
  DdNode * f,
  int * weight,
  int * support,
  int * length)
{
    DdNode      *F;
    st__table    *visited;
    DdNode      *sol;
    cuddPathPair *rootPair;
    int         complement, cost;
    int         i;

    one = DD_ONE(manager);
    zero = DD_ZERO(manager);

    /* Initialize support. Support does not depend on variable order.
    ** Hence, it does not need to be reinitialized if reordering occurs.
    */
    if (support) {
      for (i = 0; i < manager->size; i++) {
        support[i] = 0;
      }
    }

    if (f == Cudd_Not(one) || f == zero) {
      *length = DD_BIGGY;
      return(Cudd_Not(one));
    }
    /* From this point on, a path exists. */

    do {
        manager->reordered = 0;

        /* Initialize visited table. */
        visited = st__init_table( st__ptrcmp, st__ptrhash);

        /* Now get the length of the shortest path(s) from f to 1. */
        (void) getShortest(f, weight, support, visited);

        complement = Cudd_IsComplement(f);

        F = Cudd_Regular(f);

        if (! st__lookup(visited, (const char *)F, (char **)&rootPair)) return(NULL);

        if (complement) {
          cost = rootPair->neg;
        } else {
          cost = rootPair->pos;
        }

        /* Recover an actual shortest path. */
        sol = getPath(manager,visited,f,weight,cost);

        st__foreach(visited, freePathPair, NULL);
        st__free_table(visited);

    } while (manager->reordered == 1);

    *length = cost;
    return(sol);

}